

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitterSystem.h
# Opt level: O0

void __thiscall DIS::EmitterSystem::EmitterSystem(EmitterSystem *this,EmitterSystem *param_1)

{
  uchar uVar1;
  uchar uVar2;
  EmitterSystem *param_1_local;
  EmitterSystem *this_local;
  
  this->_vptr_EmitterSystem = (_func_int **)&PTR__EmitterSystem_00267440;
  uVar1 = param_1->_function;
  uVar2 = param_1->_emitterIdNumber;
  this->_emitterName = param_1->_emitterName;
  this->_function = uVar1;
  this->_emitterIdNumber = uVar2;
  return;
}

Assistant:

class OPENDIS7_EXPORT EmitterSystem
{
protected:
  /** Name of the emitter, 16 bit enumeration */
  unsigned short _emitterName; 

  /** function of the emitter, 8 bit enumeration */
  unsigned char _function; 

  /** emitter ID, 8 bit enumeration */
  unsigned char _emitterIdNumber; 


 public:
    EmitterSystem();
    virtual ~EmitterSystem();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    unsigned short getEmitterName() const; 
    void setEmitterName(unsigned short pX); 

    unsigned char getFunction() const; 
    void setFunction(unsigned char pX); 

    unsigned char getEmitterIdNumber() const; 
    void setEmitterIdNumber(unsigned char pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const EmitterSystem& rhs) const;
}